

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake.cxx
# Opt level: O2

void __thiscall cmake::SetHomeDirectory(cmake *this,string *dir)

{
  cmMessenger *this_00;
  bool bVar1;
  ProjectKind PVar2;
  string *psVar3;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *this_01;
  string_view value;
  allocator<char> local_89;
  string local_88;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_40;
  
  cmState::SetSourceDirectory
            ((this->State)._M_t.super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
             super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
             super__Head_base<0UL,_cmState_*,_false>._M_head_impl,dir);
  bVar1 = cmStateSnapshot::IsValid(&this->CurrentSnapshot);
  if (bVar1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_88,"CMAKE_SOURCE_DIR",&local_89);
    value._M_str = (dir->_M_dataplus)._M_p;
    value._M_len = dir->_M_string_length;
    cmStateSnapshot::SetDefinition(&this->CurrentSnapshot,&local_88,value);
    std::__cxx11::string::~string((string *)&local_88);
  }
  PVar2 = cmState::GetProjectKind
                    ((this->State)._M_t.
                     super___uniq_ptr_impl<cmState,_std::default_delete<cmState>_>._M_t.
                     super__Tuple_impl<0UL,_cmState_*,_std::default_delete<cmState>_>.
                     super__Head_base<0UL,_cmState_*,_false>._M_head_impl);
  this_00 = (this->Messenger)._M_t.
            super___uniq_ptr_impl<cmMessenger,_std::default_delete<cmMessenger>_>._M_t.
            super__Tuple_impl<0UL,_cmMessenger_*,_std::default_delete<cmMessenger>_>.
            super__Head_base<0UL,_cmMessenger_*,_false>._M_head_impl;
  if (PVar2 == Normal) {
    psVar3 = GetHomeDirectory_abi_cxx11_(this);
    this_01 = &local_40;
    std::_Optional_payload_base<std::__cxx11::string>::
    _Optional_payload_base<std::__cxx11::string_const&>
              ((_Optional_payload_base<std::__cxx11::string> *)this_01,psVar3);
    cmMessenger::SetTopSource
              (this_00,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_01);
  }
  else {
    this_01 = &local_68;
    local_68._M_engaged = false;
    cmMessenger::SetTopSource
              (this_00,(optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)this_01);
  }
  std::
  _Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_M_reset(this_01);
  return;
}

Assistant:

void cmake::SetHomeDirectory(const std::string& dir)
{
  this->State->SetSourceDirectory(dir);
  if (this->CurrentSnapshot.IsValid()) {
    this->CurrentSnapshot.SetDefinition("CMAKE_SOURCE_DIR", dir);
  }

  if (this->State->GetProjectKind() == cmState::ProjectKind::Normal) {
    this->Messenger->SetTopSource(this->GetHomeDirectory());
  } else {
    this->Messenger->SetTopSource(cm::nullopt);
  }
}